

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall VmaMappingHysteresis::PostUnmap(VmaMappingHysteresis *this)

{
  VmaMappingHysteresis *in_RDI;
  
  if (in_RDI->m_ExtraMapping == 0) {
    in_RDI->m_MajorCounter = in_RDI->m_MajorCounter + 1;
  }
  else {
    PostMinorCounter(in_RDI);
  }
  return;
}

Assistant:

void PostUnmap()
    {
#if VMA_MAPPING_HYSTERESIS_ENABLED
        if(m_ExtraMapping == 0)
            ++m_MajorCounter;
        else // m_ExtraMapping == 1
            PostMinorCounter();
#endif // #if VMA_MAPPING_HYSTERESIS_ENABLED
    }